

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

Value * __thiscall
cmake::ReportCapabilitiesJson(Value *__return_storage_ptr__,cmake *this,bool haveServerMode)

{
  pointer value;
  Value *pVVar1;
  mapped_type *pmVar2;
  __node_base *p_Var3;
  string *value_00;
  Value version;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generatorInfoList;
  Value generators;
  JsonValueMapType generatorMap;
  Value local_260;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&version,objectValue);
  Json::Value::Value(&local_120,"3.9.20170807-gcd520");
  pVVar1 = Json::Value::operator[](&version,"string");
  Json::Value::operator=(pVVar1,&local_120);
  Json::Value::~Value(&local_120);
  Json::Value::Value(&local_148,3);
  pVVar1 = Json::Value::operator[](&version,"major");
  Json::Value::operator=(pVVar1,&local_148);
  Json::Value::~Value(&local_148);
  Json::Value::Value(&local_170,9);
  pVVar1 = Json::Value::operator[](&version,"minor");
  Json::Value::operator=(pVVar1,&local_170);
  Json::Value::~Value(&local_170);
  Json::Value::Value(&local_198,"gcd520");
  pVVar1 = Json::Value::operator[](&version,"suffix");
  Json::Value::operator=(pVVar1,&local_198);
  Json::Value::~Value(&local_198);
  Json::Value::Value(&local_1c0,false);
  pVVar1 = Json::Value::operator[](&version,"isDirty");
  Json::Value::operator=(pVVar1,&local_1c0);
  Json::Value::~Value(&local_1c0);
  Json::Value::Value(&local_1e8,0x133c837);
  pVVar1 = Json::Value::operator[](&version,"patch");
  Json::Value::operator=(pVVar1,&local_1e8);
  Json::Value::~Value(&local_1e8);
  Json::Value::Value(&local_210,&version);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=(pVVar1,&local_210);
  Json::Value::~Value(&local_210);
  generatorInfoList.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  generatorInfoList.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  generatorInfoList.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetRegisteredGenerators(this,&generatorInfoList);
  generatorMap._M_h._M_buckets = &generatorMap._M_h._M_single_bucket;
  generatorMap._M_h._M_bucket_count = 1;
  p_Var3 = &generatorMap._M_h._M_before_begin;
  generatorMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  generatorMap._M_h._M_element_count = 0;
  generatorMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  generatorMap._M_h._M_rehash_policy._M_next_resize = 0;
  generatorMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (value_00 = &(generatorInfoList.
                    super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start)->extraName;
      value = (pointer)(value_00 + -2),
      value != generatorInfoList.
               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      value_00 = (string *)&value_00[3]._M_string_length) {
    if (*(char *)((long)&value_00[1]._M_dataplus._M_p + 2) == '\0') {
      if (value_00->_M_string_length == 0) {
        Json::Value::Value(&generators,objectValue);
        Json::Value::Value(&local_80,(string *)value);
        pVVar1 = Json::Value::operator[](&generators,"name");
        Json::Value::operator=(pVVar1,&local_80);
        Json::Value::~Value(&local_80);
        Json::Value::Value(&local_a8,*(bool *)&value_00[1]._M_dataplus._M_p);
        pVVar1 = Json::Value::operator[](&generators,"toolsetSupport");
        Json::Value::operator=(pVVar1,&local_a8);
        Json::Value::~Value(&local_a8);
        Json::Value::Value(&local_d0,*(bool *)((long)&value_00[1]._M_dataplus._M_p + 1));
        pVVar1 = Json::Value::operator[](&generators,"platformSupport");
        Json::Value::operator=(pVVar1,&local_d0);
        Json::Value::~Value(&local_d0);
        Json::Value::Value(&local_f8,arrayValue);
        pVVar1 = Json::Value::operator[](&generators,"extraGenerators");
        Json::Value::operator=(pVVar1,&local_f8);
        Json::Value::~Value(&local_f8);
        Json::Value::Value(&local_58,&generators);
        pmVar2 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&generatorMap,(key_type *)value);
        Json::Value::operator=(pmVar2,&local_58);
        Json::Value::~Value(&local_58);
      }
      else {
        pmVar2 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&generatorMap,value_00 + -1);
        pVVar1 = Json::Value::operator[](pmVar2,"extraGenerators");
        Json::Value::Value(&generators,value_00);
        Json::Value::append(pVVar1,&generators);
      }
      Json::Value::~Value(&generators);
    }
  }
  Json::Value::Value(&generators,arrayValue);
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    Json::Value::append(&generators,(Value *)(p_Var3 + 5));
  }
  Json::Value::Value(&local_238,&generators);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"generators");
  Json::Value::operator=(pVVar1,&local_238);
  Json::Value::~Value(&local_238);
  Json::Value::Value(&local_260,haveServerMode);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"serverMode");
  Json::Value::operator=(pVVar1,&local_260);
  Json::Value::~Value(&local_260);
  Json::Value::~Value(&generators);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&generatorMap._M_h);
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
            (&generatorInfoList);
  Json::Value::~Value(&version);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmake::ReportCapabilitiesJson(bool haveServerMode) const
{
  Json::Value obj = Json::objectValue;
  // Version information:
  Json::Value version = Json::objectValue;
  version["string"] = CMake_VERSION;
  version["major"] = CMake_VERSION_MAJOR;
  version["minor"] = CMake_VERSION_MINOR;
  version["suffix"] = CMake_VERSION_SUFFIX;
  version["isDirty"] = (CMake_VERSION_IS_DIRTY == 1);
  version["patch"] = CMake_VERSION_PATCH;

  obj["version"] = version;

  // Generators:
  std::vector<cmake::GeneratorInfo> generatorInfoList;
  this->GetRegisteredGenerators(generatorInfoList);

  JsonValueMapType generatorMap;
  for (std::vector<cmake::GeneratorInfo>::const_iterator i =
         generatorInfoList.begin();
       i != generatorInfoList.end(); ++i) {
    if (i->isAlias) { // skip aliases, they are there for compatibility reasons
                      // only
      continue;
    }

    if (i->extraName.empty()) {
      Json::Value gen = Json::objectValue;
      gen["name"] = i->name;
      gen["toolsetSupport"] = i->supportsToolset;
      gen["platformSupport"] = i->supportsPlatform;
      gen["extraGenerators"] = Json::arrayValue;
      generatorMap[i->name] = gen;
    } else {
      Json::Value& gen = generatorMap[i->baseName];
      gen["extraGenerators"].append(i->extraName);
    }
  }

  Json::Value generators = Json::arrayValue;
  for (JsonValueMapType::const_iterator i = generatorMap.begin();
       i != generatorMap.end(); ++i) {
    generators.append(i->second);
  }
  obj["generators"] = generators;
  obj["serverMode"] = haveServerMode;

  return obj;
}